

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O0

void printid(void)

{
  LogLevel LVar1;
  sz_pid_t v;
  LogStream *pLVar2;
  self *psVar3;
  SourceFile file;
  SourceFile file_00;
  Timestamp local_1ff8 [4];
  undefined1 local_1fd8 [12];
  Logger local_1fc8;
  undefined1 local_fe8 [12];
  Logger local_fd8;
  
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_fe8,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_fe8._0_8_;
    file.m_size = local_fe8._8_4_;
    sznet::Logger::Logger(&local_fd8,file,0x17);
    pLVar2 = sznet::Logger::stream(&local_fd8);
    psVar3 = sznet::LogStream::operator<<(pLVar2,"pid = ");
    v = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar3,v);
    sznet::Logger::~Logger(&local_fd8);
  }
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_1fd8,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1fd8._0_8_;
    file_00.m_size = local_1fd8._8_4_;
    sznet::Logger::Logger(&local_1fc8,file_00,0x18);
    pLVar2 = sznet::Logger::stream(&local_1fc8);
    psVar3 = sznet::LogStream::operator<<(pLVar2,"now ");
    sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(local_1ff8,false);
    sznet::LogStream::operator<<(psVar3,(string *)local_1ff8);
    std::__cxx11::string::~string((string *)local_1ff8);
    sznet::Logger::~Logger(&local_1fc8);
  }
  return;
}

Assistant:

void printid()
{
	LOG_INFO << "pid = " << CurrentThread::tid();
	LOG_INFO << "now " << Timestamp::now().toFormattedString();
}